

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O3

void __thiscall Gc_SpawnTwo_Test::TestBody(Gc_SpawnTwo_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *path;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *path_00;
  int in_EDX;
  int count;
  thread thread;
  spawn_params call1;
  spawn_params call0;
  test_watch_thread gc;
  long local_1c0;
  long *local_1b8;
  spawn_params local_1b0;
  spawn_params local_188;
  test_watch_thread local_160;
  
  (anonymous_namespace)::Gc::call_params_abi_cxx11_(&local_188,(Gc *)0x0,in_EDX);
  (anonymous_namespace)::Gc::call_params_abi_cxx11_(&local_1b0,(Gc *)0x1,count);
  anon_unknown.dwarf_5c2dc::test_watch_thread::test_watch_thread(&local_160);
  path = &local_188.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ;
  anon_unknown.dwarf_5c2dc::Gc::expect_call
            (&local_160,&path->_M_head_impl,
             (process_identifier)
             local_188.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  path_00 = &local_1b0.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ;
  anon_unknown.dwarf_5c2dc::Gc::expect_call
            (&local_160,&path_00->_M_head_impl,
             (process_identifier)
             local_1b0.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_1c0 = 0;
  local_1b8 = (long *)operator_new(0x10);
  *local_1b8 = (long)&PTR___State_001960d8;
  local_1b8[1] = (long)&local_160;
  std::thread::_M_start_thread(&local_1c0,&local_1b8,0);
  if (local_1b8 != (long *)0x0) {
    (**(code **)(*local_1b8 + 8))();
  }
  pstore::broker::gc_watch_thread::start_vacuum
            (&local_160.super_gc_watch_thread,&path->_M_head_impl);
  pstore::broker::gc_watch_thread::start_vacuum
            (&local_160.super_gc_watch_thread,&path_00->_M_head_impl);
  pstore::broker::gc_watch_thread::start_vacuum
            (&local_160.super_gc_watch_thread,&path->_M_head_impl);
  pstore::broker::gc_watch_thread::start_vacuum
            (&local_160.super_gc_watch_thread,&path_00->_M_head_impl);
  pstore::broker::gc_watch_thread::stop(&local_160.super_gc_watch_thread,-1);
  std::thread::join();
  if (local_1c0 == 0) {
    local_160.super_gc_watch_thread._vptr_gc_watch_thread =
         (_func_int **)&PTR__test_watch_thread_00196010;
    testing::internal::FunctionMocker<void_(const_int_&)>::~FunctionMocker
              (&local_160.gmock01_kill_50);
    testing::internal::FunctionMocker<int_(std::initializer_list<const_char_*>)>::~FunctionMocker
              (&local_160.gmock01_spawn_49);
    pstore::broker::gc_watch_thread::~gc_watch_thread(&local_160.super_gc_watch_thread);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p !=
        &local_1b0.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl.field_2) {
      operator_delete(local_1b0.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_1b0.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p !=
        &local_188.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl.field_2) {
      operator_delete(local_188.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_188.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::terminate();
}

Assistant:

TEST_F (Gc, SpawnTwo) {
    auto call0 = call_params (0);
    auto call1 = call_params (1);

    test_watch_thread gc;
    expect_call (gc, call0);
    expect_call (gc, call1);

    std::thread thread{[&gc] () { gc.watcher (); }};

    gc.start_vacuum (std::get<std::string> (call0));
    gc.start_vacuum (std::get<std::string> (call1));
    gc.start_vacuum (std::get<std::string> (call0));
    gc.start_vacuum (std::get<std::string> (call1));

    gc.stop ();
    thread.join ();
}